

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O3

void __thiscall
pstore::
error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
::
move_construct<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
          (error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
           *this,error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                 *rhs)

{
  error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
  eVar1;
  error_code *peVar2;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *this_00;
  tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>
  *ptVar3;
  error_code eVar4;
  
  eVar1 = (error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
           )rhs->has_error_;
  this[0x18] = eVar1;
  if (eVar1 == (error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
                )0x1) {
    peVar2 = error_storage_impl<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::error_code>
                       ((error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                         *)this);
    eVar4 = error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
            ::get_error(rhs);
    peVar2->_M_value = eVar4._M_value;
    peVar2->_M_cat = eVar4._M_cat;
  }
  else {
    this_00 = (span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)
              value_storage_impl<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
                        ((error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                          *)this);
    ptVar3 = value_storage_impl<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
                       (rhs);
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
              (this_00,(ptVar3->
                       super__Tuple_impl<0UL,_int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>
                       ).
                       super__Tuple_impl<1UL,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>
                       .
                       super__Head_base<1UL,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>,_false>
                       ._M_head_impl.span_,
               (ptVar3->
               super__Tuple_impl<0UL,_int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>
               ).
               super__Tuple_impl<1UL,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>
               .
               super__Head_base<1UL,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>,_false>
               ._M_head_impl.index_);
    *(int *)&this_00[1].span_ =
         (ptVar3->
         super__Tuple_impl<0UL,_int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>
         ).super__Head_base<0UL,_int,_false>._M_head_impl;
  }
  return;
}

Assistant:

void error_or<T>::move_construct (error_or<Other> && rhs) noexcept {
        has_error_ = rhs.has_error_;
        if (has_error_) {
            new (get_error_storage ()) std::error_code (rhs.get_error ());
        } else {
            new (get_storage ()) storage_type (std::move (*rhs.get_storage ()));
        }
    }